

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dynamic_string.cpp
# Opt level: O2

int __thiscall crnlib::dynamic_string::toupper(dynamic_string *this,int __c)

{
  char *p;
  
  if (this->m_len != 0) {
    p = "";
    if (this->m_pStr != (char *)0x0) {
      p = this->m_pStr;
    }
    strupr(p);
  }
  return (int)this;
}

Assistant:

dynamic_string& dynamic_string::toupper()
    {
        if (m_len)
        {
#if defined(CRN_CC_MSVC)
            _strupr_s(get_ptr_priv(), m_buf_size);
#else
            strupr(get_ptr_priv());
#endif
        }
        return *this;
    }